

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBBlendRow_C(uint8_t *src_argb0,uint8_t *src_argb1,uint8_t *dst_argb,int width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  int32_t iVar6;
  uint in_ECX;
  undefined1 *in_RDX;
  byte *in_RSI;
  byte *in_RDI;
  uint32_t br_1;
  uint32_t bg_1;
  uint32_t bb_1;
  uint32_t a_1;
  uint32_t fr_1;
  uint32_t fg_1;
  uint32_t fb_1;
  uint32_t br;
  uint32_t bg;
  uint32_t bb;
  uint32_t a;
  uint32_t fr;
  uint32_t fg;
  uint32_t fb;
  int x;
  int local_20;
  undefined1 *local_18;
  byte *local_10;
  byte *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_20 = 0; local_20 < (int)(in_ECX - 1); local_20 = local_20 + 2) {
    bVar1 = local_8[1];
    bVar2 = local_8[2];
    uVar5 = (uint)local_8[3];
    bVar3 = local_10[1];
    bVar4 = local_10[2];
    iVar6 = libyuv::clamp255(((0x100 - uVar5) * (uint)*local_10 >> 8) + (uint)*local_8);
    *local_18 = (char)iVar6;
    iVar6 = libyuv::clamp255(((0x100 - uVar5) * (uint)bVar3 >> 8) + (uint)bVar1);
    local_18[1] = (char)iVar6;
    iVar6 = libyuv::clamp255(((0x100 - uVar5) * (uint)bVar4 >> 8) + (uint)bVar2);
    local_18[2] = (char)iVar6;
    local_18[3] = 0xff;
    bVar1 = local_8[5];
    bVar2 = local_8[6];
    uVar5 = (uint)local_8[7];
    bVar3 = local_10[5];
    bVar4 = local_10[6];
    iVar6 = libyuv::clamp255(((0x100 - uVar5) * (uint)local_10[4] >> 8) + (uint)local_8[4]);
    local_18[4] = (char)iVar6;
    iVar6 = libyuv::clamp255(((0x100 - uVar5) * (uint)bVar3 >> 8) + (uint)bVar1);
    local_18[5] = (char)iVar6;
    iVar6 = libyuv::clamp255(((0x100 - uVar5) * (uint)bVar4 >> 8) + (uint)bVar2);
    local_18[6] = (char)iVar6;
    local_18[7] = 0xff;
    local_8 = local_8 + 8;
    local_10 = local_10 + 8;
    local_18 = local_18 + 8;
  }
  if ((in_ECX & 1) != 0) {
    bVar1 = local_8[1];
    bVar2 = local_8[2];
    uVar5 = (uint)local_8[3];
    bVar3 = local_10[1];
    bVar4 = local_10[2];
    iVar6 = libyuv::clamp255(((0x100 - uVar5) * (uint)*local_10 >> 8) + (uint)*local_8);
    *local_18 = (char)iVar6;
    iVar6 = libyuv::clamp255(((0x100 - uVar5) * (uint)bVar3 >> 8) + (uint)bVar1);
    local_18[1] = (char)iVar6;
    iVar6 = libyuv::clamp255(((0x100 - uVar5) * (uint)bVar4 >> 8) + (uint)bVar2);
    local_18[2] = (char)iVar6;
    local_18[3] = 0xff;
  }
  return;
}

Assistant:

void ARGBBlendRow_C(const uint8_t* src_argb0,
                    const uint8_t* src_argb1,
                    uint8_t* dst_argb,
                    int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    uint32_t fb = src_argb0[0];
    uint32_t fg = src_argb0[1];
    uint32_t fr = src_argb0[2];
    uint32_t a = src_argb0[3];
    uint32_t bb = src_argb1[0];
    uint32_t bg = src_argb1[1];
    uint32_t br = src_argb1[2];
    dst_argb[0] = BLEND(fb, bb, a);
    dst_argb[1] = BLEND(fg, bg, a);
    dst_argb[2] = BLEND(fr, br, a);
    dst_argb[3] = 255u;

    fb = src_argb0[4 + 0];
    fg = src_argb0[4 + 1];
    fr = src_argb0[4 + 2];
    a = src_argb0[4 + 3];
    bb = src_argb1[4 + 0];
    bg = src_argb1[4 + 1];
    br = src_argb1[4 + 2];
    dst_argb[4 + 0] = BLEND(fb, bb, a);
    dst_argb[4 + 1] = BLEND(fg, bg, a);
    dst_argb[4 + 2] = BLEND(fr, br, a);
    dst_argb[4 + 3] = 255u;
    src_argb0 += 8;
    src_argb1 += 8;
    dst_argb += 8;
  }

  if (width & 1) {
    uint32_t fb = src_argb0[0];
    uint32_t fg = src_argb0[1];
    uint32_t fr = src_argb0[2];
    uint32_t a = src_argb0[3];
    uint32_t bb = src_argb1[0];
    uint32_t bg = src_argb1[1];
    uint32_t br = src_argb1[2];
    dst_argb[0] = BLEND(fb, bb, a);
    dst_argb[1] = BLEND(fg, bg, a);
    dst_argb[2] = BLEND(fr, br, a);
    dst_argb[3] = 255u;
  }
}